

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheRelease(PgHdr *p)

{
  i16 *piVar1;
  int *piVar2;
  PCache *pPVar3;
  
  piVar1 = &p->nRef;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    piVar2 = &p->pCache->nRef;
    *piVar2 = *piVar2 + -1;
    if ((p->flags & 2) == 0) {
      pPVar3 = p->pCache;
      if (pPVar3->bPurgeable != '\0') {
        if (p->pgno == 1) {
          pPVar3->pPage1 = (PgHdr *)0x0;
        }
        (*sqlite3Config.pcache2.xUnpin)(pPVar3->pCache,p->pPage,0);
        return;
      }
      return;
    }
    if (p->pDirtyPrev != (PgHdr *)0x0) {
      pcacheManageDirtyList(p,'\x03');
      return;
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->nRef--;
  if( p->nRef==0 ){
    p->pCache->nRef--;
    if( (p->flags&PGHDR_DIRTY)==0 ){
      pcacheUnpin(p);
    }else if( p->pDirtyPrev!=0 ){
      /* Move the page to the head of the dirty list. */
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    }
  }
}